

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O3

void * OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk,void *p)

{
  size_t sVar1;
  void **ppvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t __n;
  size_t sVar5;
  void *ret;
  
  if ((sk != (OPENSSL_STACK *)0x0) && (sVar1 = sk->num, sVar1 != 0)) {
    ppvVar2 = sk->data;
    __n = sVar1 * 8;
    sVar5 = 0;
    do {
      __n = __n - 8;
      pvVar3 = ppvVar2[sVar5];
      if (pvVar3 == p) {
        sVar4 = sVar5;
        if ((sVar1 - 1 != sVar5) && (sVar4 = sVar1 - 1, __n != 0)) {
          memmove(ppvVar2 + sVar5,ppvVar2 + sVar5 + 1,__n);
          sVar4 = sk->num - 1;
        }
        sk->num = sVar4;
        return pvVar3;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk, const void *p) {
  if (sk == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] == p) {
      return OPENSSL_sk_delete(sk, i);
    }
  }

  return NULL;
}